

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O0

magic_realm * lookup_realm(char *name)

{
  wchar_t wVar1;
  magic_realm *local_20;
  magic_realm *realm;
  char *name_local;
  
  local_20 = realms;
  while( true ) {
    if (local_20 == (magic_realm *)0x0) {
      quit_fmt("Failed to find %s magic realm",name);
      return (magic_realm *)0x0;
    }
    wVar1 = my_stricmp(name,local_20->name);
    if (wVar1 == L'\0') break;
    local_20 = local_20->next;
  }
  return local_20;
}

Assistant:

const struct magic_realm *lookup_realm(const char *name)
{
	struct magic_realm *realm = realms;
	while (realm) {
		if (!my_stricmp(name, realm->name)) {
			return realm;
		}
		realm = realm->next;
	}

	/* Fail horribly */
	quit_fmt("Failed to find %s magic realm", name);
	return realm;
}